

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSerialize.cpp
# Opt level: O3

ParseTokenKind __thiscall
TTD::TextFormatReader::Scan
          (TextFormatReader *this,
          List<char16_t,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          *charList)

{
  bool bVar1;
  ParseTokenKind PVar2;
  ulong in_RAX;
  undefined8 uStack_38;
  char16 c;
  
  uStack_38 = in_RAX & 0xffffffffffff;
  (charList->super_ReadOnlyList<char16_t,_Memory::HeapAllocator,_DefaultComparer>).count = 0;
  bVar1 = FileReader::ReadRawChar(&this->super_FileReader,(char16 *)((long)&uStack_38 + 6));
  if (!bVar1) {
    return Error;
  }
  if ((ushort)uStack_38._6_2_ < 0x5b) {
    if ((ushort)uStack_38._6_2_ - 9 < 0x38) {
      PVar2 = (*(code *)(&DAT_010e4b48 +
                        *(int *)(&DAT_010e4b48 + (ulong)((ushort)uStack_38._6_2_ - 9) * 4)))();
      return PVar2;
    }
    if (uStack_38._6_2_ == L'\0') {
      return Error;
    }
  }
  else if ((ushort)uStack_38._6_2_ < 0x7b) {
    if (uStack_38._6_2_ == L'[') {
      return LBrack;
    }
    if (uStack_38._6_2_ == L']') {
      return RBrack;
    }
  }
  else {
    if (uStack_38._6_2_ == L'{') {
      return LCurly;
    }
    if (uStack_38._6_2_ == L'~') {
      PVar2 = ScanWellKnownToken(this,charList);
      return PVar2;
    }
    if (uStack_38._6_2_ == L'}') {
      return RCurly;
    }
  }
  PVar2 = ScanNakedString(this,uStack_38._6_2_);
  return PVar2;
}

Assistant:

NSTokens::ParseTokenKind TextFormatReader::Scan(JsUtil::List<char16, HeapAllocator>& charList)
    {
        char16 c = _u('\0');
        charList.Clear();

        while(this->ReadRawChar(&c))
        {
            switch(c)
            {
            case 0:
                return NSTokens::ParseTokenKind::Error; //we shouldn't hit EOF explicitly here
            case _u('\t'):
            case _u('\r'):
            case _u('\n'):
            case _u(' '):
                //WS - keep looping
                break;
            case _u(','):
                return NSTokens::ParseTokenKind::Comma;
            case _u(':'):
                return NSTokens::ParseTokenKind::Colon;
            case _u('['):
                return NSTokens::ParseTokenKind::LBrack;
            case _u(']'):
                return NSTokens::ParseTokenKind::RBrack;
            case _u('{'):
                return NSTokens::ParseTokenKind::LCurly;
            case _u('}'):
                return NSTokens::ParseTokenKind::RCurly;
            case _u('#'):
                //# starts special double/number value representation
                return this->ScanSpecialNumber();
            case _u('-'):
            case _u('+'):
            case _u('0'):
            case _u('1'):
            case _u('2'):
            case _u('3'):
            case _u('4'):
            case _u('5'):
            case _u('6'):
            case _u('7'):
            case _u('8'):
            case _u('9'):
                //decimal digit or (-,+) starts a number
                charList.Add(c);
                return this->ScanNumber(charList);
            case _u('*'):
                //address
                return this->ScanAddress(charList);
            case _u('!'):
                //log tag
                return this->ScanLogTag(charList);
            case _u('$'):
                //enumeration value tag
                return this->ScanEnumTag(charList);
            case _u('~'):
                //wellknown token
                return this->ScanWellKnownToken(charList);
            case _u('@'):
                //string
                return this->ScanString(charList);
            default:
                //it is a naked literal value (or an error)
                return this->ScanNakedString(c);
            }
        }

        return NSTokens::ParseTokenKind::Error;
    }